

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prefix.c
# Opt level: O1

void prefixes_use_segment(_iflags defaultSeg,_PrefixState *ps,_DecodeType dt,_DInst *di)

{
  uint uVar1;
  
  uVar1 = ps->decodedPrefixes;
  if (dt == Decode64Bits) {
    if ((uVar1 & 0x1800) != 0) {
      di->segment = (uVar1 >> 0xc & 1) == 0 ^ 0x49;
      return;
    }
  }
  else {
    uVar1 = uVar1 & 0x1f80;
    if (uVar1 == defaultSeg || uVar1 == 0) {
      if (defaultSeg == 0x100) {
        di->segment = 0xc6;
        return;
      }
      di->segment = 199;
    }
    else {
      ps->usedPrefixes = ps->usedPrefixes | uVar1;
      uVar1 = uVar1 >> 7;
      switch(uVar1) {
      case 1:
        di->segment = 'E';
        return;
      case 2:
        di->segment = 'F';
        return;
      case 3:
      case 5:
      case 6:
      case 7:
        break;
      case 4:
        di->segment = 'G';
        return;
      case 8:
        di->segment = 'D';
        return;
      default:
        if (uVar1 == 0x10) {
          di->segment = 'H';
          return;
        }
        if (uVar1 == 0x20) {
          di->segment = 'I';
          return;
        }
      }
    }
  }
  return;
}

Assistant:

void prefixes_use_segment(_iflags defaultSeg, _PrefixState* ps, _DecodeType dt, _DInst* di)
{
	/* Extract given segment prefix from the decoded prefixes. */
	_iflags flags;

	if (dt == Decode64Bits) {
		if (ps->decodedPrefixes & INST_PRE_SEGOVRD_MASK64) { /* Either GS or FS. */
			di->segment = ps->decodedPrefixes & INST_PRE_GS ? R_GS : R_FS;
		}

		return;
	}

	flags = ps->decodedPrefixes & INST_PRE_SEGOVRD_MASK;

	/* Use the given prefix only if it's not the default. */
	if (flags && (flags != defaultSeg)) {
		ps->usedPrefixes |= flags;

		switch (flags >> 7) /* INST_PRE_CS is 1 << 7. And the rest of the prefixes follow as bit fields. */
		{
			case 1: di->segment = R_CS; break;
			case 2: di->segment = R_SS; break;
			case 4: di->segment = R_DS; break;
			case 8: di->segment = R_ES; break;
			case 0x10: di->segment = R_FS; break;
			case 0x20: di->segment = R_GS; break;
		}
	}
	else {
		if (defaultSeg == INST_PRE_SS) di->segment = SEGMENT_DEFAULT | R_SS;
		else di->segment = SEGMENT_DEFAULT | R_DS;
	}
}